

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_callback_helper.h
# Opt level: O0

void __thiscall
miniros::
SubscriptionCallbackHelperT<const_miniros::MessageEvent<const_miniros::topic_tools::ShapeShifter>_&,_void>
::call(SubscriptionCallbackHelperT<const_miniros::MessageEvent<const_miniros::topic_tools::ShapeShifter>_&,_void>
       *this,SubscriptionCallbackHelperCallParams *params)

{
  MessageEvent<const_miniros::topic_tools::ShapeShifter> *in_RDI;
  Event event;
  MessageEvent<const_miniros::topic_tools::ShapeShifter> *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  MessageEvent<const_miniros::topic_tools::ShapeShifter> *in_stack_ffffffffffffffe0;
  
  MessageEvent<const_miniros::topic_tools::ShapeShifter>::MessageEvent
            (in_stack_ffffffffffffffe0,(MessageEvent<const_void> *)in_stack_ffffffffffffffd8,
             (CreateFunction *)in_stack_ffffffffffffffd0);
  ParameterAdapter<const_miniros::MessageEvent<const_miniros::topic_tools::ShapeShifter>_&>::
  getParameter((Event *)&stack0xffffffffffffff90);
  std::function<void_(const_miniros::MessageEvent<const_miniros::topic_tools::ShapeShifter>_&)>::
  operator()((function<void_(const_miniros::MessageEvent<const_miniros::topic_tools::ShapeShifter>_&)>
              *)in_RDI,in_stack_ffffffffffffff58);
  MessageEvent<const_miniros::topic_tools::ShapeShifter>::~MessageEvent(in_RDI);
  return;
}

Assistant:

virtual void call(SubscriptionCallbackHelperCallParams& params)
  {
    Event event(params.event, create_);
    callback_(ParameterAdapter<P>::getParameter(event));
  }